

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O3

bool __thiscall uv::TCPClient::SetKeepAlive(TCPClient *this,int enable,uint delay)

{
  char *__s;
  long lVar1;
  pointer pcVar2;
  int errcode;
  uint uVar3;
  uint uVar4;
  ILog4zManager *pIVar5;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  ulong uVar6;
  char *pcVar7;
  long *in_FS_OFFSET;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  errcode = uv_tcp_keepalive(this->client_handle_,CONCAT44(in_register_00000034,enable),
                             CONCAT44(in_register_00000014,delay));
  if (errcode == 0) goto LAB_001180b2;
  GetUVError_abi_cxx11_(&local_50,errcode);
  std::__cxx11::string::operator=((string *)&this->errmsg_,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  lVar1 = *in_FS_OFFSET;
  __s = (char *)(lVar1 + -0x800);
  pcVar2 = (this->errmsg_)._M_dataplus._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + (this->errmsg_)._M_string_length);
  uVar3 = snprintf(__s,0x800,"%s",local_70[0]);
  pcVar7 = __s;
  uVar4 = 0;
  if ((int)uVar3 < 0) {
LAB_00117f36:
    uVar3 = uVar4;
    *pcVar7 = '\0';
  }
  else if (0x7ff < uVar3) {
    pcVar7 = (char *)(lVar1 + -1);
    uVar4 = 0x800;
    goto LAB_00117f36;
  }
  uVar6 = (ulong)uVar3;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (uVar3 < 0x800) {
    pcVar7 = __s + uVar6;
    uVar3 = 0;
    uVar4 = snprintf(pcVar7,0x800 - uVar6,"%s"," ( ");
    if ((int)uVar4 < 0) {
LAB_00117f9b:
      *pcVar7 = '\0';
      uVar4 = uVar3;
    }
    else {
      uVar3 = (uint)(0x800 - uVar6);
      if (uVar3 <= uVar4) {
        pcVar7 = (char *)(lVar1 + -1);
        goto LAB_00117f9b;
      }
    }
    uVar6 = uVar6 + uVar4;
  }
  if (uVar6 < 0x800) {
    pcVar7 = __s + uVar6;
    uVar3 = 0;
    uVar4 = snprintf(pcVar7,0x800 - uVar6,"%s"," ");
    if ((int)uVar4 < 0) {
LAB_00117ff1:
      *pcVar7 = '\0';
      uVar4 = uVar3;
    }
    else {
      uVar3 = (uint)(0x800 - uVar6);
      if (uVar3 <= uVar4) {
        pcVar7 = (char *)(lVar1 + -1);
        goto LAB_00117ff1;
      }
    }
    uVar6 = uVar6 + uVar4;
    if (uVar6 < 0x800) {
      pcVar7 = __s + uVar6;
      uVar3 = 0;
      uVar4 = snprintf(pcVar7,0x800 - uVar6,"%s"," ) : ");
      if ((int)uVar4 < 0) {
LAB_00118047:
        *pcVar7 = '\0';
        uVar4 = uVar3;
      }
      else {
        uVar3 = (uint)(0x800 - uVar6);
        if (uVar3 <= uVar4) {
          pcVar7 = (char *)(lVar1 + -1);
          goto LAB_00118047;
        }
      }
      uVar6 = uVar6 + uVar4;
      if (uVar6 < 0x800) {
        pcVar7 = __s + uVar6;
        uVar4 = snprintf(pcVar7,0x800 - uVar6,"%d",0xa1);
        if (-1 < (int)uVar4) {
          if (uVar4 < (uint)(0x800 - uVar6)) goto LAB_00118099;
          pcVar7 = (char *)(lVar1 + -1);
        }
        *pcVar7 = '\0';
      }
    }
  }
LAB_00118099:
  pIVar5 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar5->_vptr_ILog4zManager[8])(pIVar5,0,3,__s);
LAB_001180b2:
  return errcode == 0;
}

Assistant:

bool TCPClient::SetKeepAlive(int enable, unsigned int delay)
{
    int iret = uv_tcp_keepalive(&client_handle_->tcphandle, enable , delay);
    if (iret) {
        errmsg_ = GetUVError(iret);
        LOGE(errmsg_);
        return false;
    }
    return true;
}